

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  uint uVar2;
  REF_INT node3;
  REF_INT node2;
  REF_INT ncell;
  REF_INT cell_to_swap [2];
  REF_DBL quality3;
  REF_DBL quality2;
  REF_DBL quality1;
  REF_DBL quality0;
  REF_INT nodes [27];
  REF_INT local_dc;
  REF_INT local_d8;
  int local_d4;
  REF_INT local_d0;
  REF_INT local_cc;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *allowed = 0;
  uVar1 = ref_swap_node23(ref_grid,node0,node1,&local_d8,&local_dc);
  if (uVar1 == 0) {
    uVar2 = ref_cell_list_with2(ref_cell,node0,node1,2,&local_d4,&local_d0);
    if (uVar2 == 0) {
      uVar2 = uVar1;
      if ((long)local_d4 != 2) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x290,"ref_swap_quality","there should be two triangles for manifold",2,
               (long)local_d4);
        uVar2 = 1;
      }
      if (local_d4 == 2) {
        uVar2 = ref_cell_nodes(ref_cell,local_d0,&local_a8);
        if (uVar2 == 0) {
          uVar2 = ref_node_tri_quality(ref_node,&local_a8,&local_b0);
          if (uVar2 == 0) {
            uVar2 = ref_cell_nodes(ref_cell,local_cc,&local_a8);
            if (uVar2 == 0) {
              uVar2 = ref_node_tri_quality(ref_node,&local_a8,&local_b8);
              if (uVar2 == 0) {
                local_a4 = local_dc;
                local_a0 = local_d8;
                local_a8 = node0;
                uVar2 = ref_node_tri_quality(ref_node,&local_a8,&local_c0);
                if (uVar2 == 0) {
                  local_a4 = local_d8;
                  local_a0 = local_dc;
                  local_a8 = node1;
                  uVar2 = ref_node_tri_quality(ref_node,&local_a8,&local_c8);
                  if (uVar2 == 0) {
                    if (local_c8 <= local_c0) {
                      local_c0 = local_c8;
                    }
                    if (local_b8 <= local_b0) {
                      local_b0 = local_b8;
                    }
                    if (local_b0 <= local_c0) {
                      *allowed = 1;
                    }
                    else {
                      *allowed = 0;
                    }
                    uVar2 = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x29d,"ref_swap_quality",(ulong)uVar2,"qual");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,0x299,"ref_swap_quality",(ulong)uVar2,"qual");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x295,"ref_swap_quality",(ulong)uVar2,"qual");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0x294,"ref_swap_quality",(ulong)uVar2,"nodes tri1");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x293,"ref_swap_quality",(ulong)uVar2,"qual");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x292,"ref_swap_quality",(ulong)uVar2,"nodes tri0");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x28f,
             "ref_swap_quality",(ulong)uVar2,"more then two");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x28c,
           "ref_swap_quality",(ulong)uVar1,"other nodes");
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_swap_quality(REF_GRID ref_grid, REF_INT node0,
                                    REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ncell, cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_DBL quality0, quality1, quality2, quality3;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");

  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");

  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality0), "qual");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[1], nodes), "nodes tri1");
  RSS(ref_node_tri_quality(ref_node, nodes, &quality1), "qual");
  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality2), "qual");
  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RSS(ref_node_tri_quality(ref_node, nodes, &quality3), "qual");

  if (MIN(quality2, quality3) < MIN(quality0, quality1)) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  *allowed = REF_TRUE;
  return REF_SUCCESS;
}